

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall
cxxopts::values::
abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
abstract_value(abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar2;
  
  (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_00132a30;
  (this->m_result).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_result).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->m_result).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 2) = 0;
  *(undefined8 *)((long)&this->m_store + 2) = 0;
  (this->m_default_value)._M_dataplus._M_p = (pointer)&(this->m_default_value).field_2;
  (this->m_default_value)._M_string_length = 0;
  (this->m_default_value).field_2._M_local_buf[0] = '\0';
  (this->m_implicit_value)._M_dataplus._M_p = (pointer)&(this->m_implicit_value).field_2;
  (this->m_implicit_value)._M_string_length = 0;
  (this->m_implicit_value).field_2._M_local_buf[0] = '\0';
  if ((rhs->m_result).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    psVar2 = (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&rhs->m_store;
  }
  else {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    psVar2 = &this->m_result;
    p_Var1->_M_use_count = 1;
    p_Var1->_M_weak_count = 1;
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00132ab0;
    p_Var1[1]._vptr__Sp_counted_base = (_func_int **)(p_Var1 + 2);
    p_Var1[1]._M_use_count = 0;
    p_Var1[1]._M_weak_count = 0;
    *(undefined1 *)&p_Var1[2]._vptr__Sp_counted_base = 0;
    (this->m_result).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var1 + 1);
    this_00 = (this->m_result).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->m_result).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var1;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  this->m_store =
       (psVar2->
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  this->m_default = rhs->m_default;
  this->m_implicit = rhs->m_implicit;
  std::__cxx11::string::_M_assign((string *)&this->m_default_value);
  std::__cxx11::string::_M_assign((string *)&this->m_implicit_value);
  return;
}

Assistant:

abstract_value(const abstract_value& rhs)
      {
        if (rhs.m_result)
        {
          m_result = std::make_shared<T>();
          m_store = m_result.get();
        }
        else
        {
          m_store = rhs.m_store;
        }

        m_default = rhs.m_default;
        m_implicit = rhs.m_implicit;
        m_default_value = rhs.m_default_value;
        m_implicit_value = rhs.m_implicit_value;
      }